

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright3(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec3,int *ridx3,int *rn3,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps3)

{
  uint *puVar1;
  undefined1 uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  fpclass_type fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  cpp_dec_float<100U,_int,_void> *pcVar20;
  cpp_dec_float<100U,_int,_void> *pcVar21;
  int iVar22;
  long lVar23;
  int *piVar24;
  cpp_dec_float<100U,_int,_void> *pcVar25;
  fpclass_type fVar26;
  int32_t iVar27;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_13;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  undefined1 local_ac8 [16];
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  uint local_a98 [3];
  undefined3 uStack_a8b;
  int iStack_a88;
  bool bStack_a84;
  undefined8 local_a80;
  ulong local_a78;
  int *local_a70;
  cpp_dec_float<100U,_int,_void> local_a68;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a10;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a08;
  int local_9fc;
  cpp_dec_float<100U,_int,_void> local_9f8;
  long local_9a0;
  cpp_dec_float<100U,_int,_void> local_998;
  int *local_940;
  int *local_938;
  int *local_930;
  pointer local_928;
  ulong local_920;
  int local_914;
  int *local_910;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_908;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_900;
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  uint local_8c8 [3];
  undefined3 uStack_8bb;
  int iStack_8b8;
  bool bStack_8b4;
  undefined8 local_8b0;
  undefined1 local_8a8 [24];
  uint auStack_890 [2];
  undefined1 local_888 [16];
  uint local_878 [3];
  undefined3 uStack_86b;
  int iStack_868;
  bool bStack_864;
  undefined8 local_860;
  undefined1 local_858 [24];
  uint auStack_840 [2];
  undefined1 local_838 [16];
  uint local_828 [3];
  undefined3 uStack_81b;
  int iStack_818;
  bool bStack_814;
  undefined8 local_810;
  undefined1 local_808 [24];
  uint auStack_7f0 [2];
  undefined1 local_7e8 [16];
  uint local_7d8 [3];
  undefined3 uStack_7cb;
  int iStack_7c8;
  bool bStack_7c4;
  undefined8 local_7c0;
  undefined1 local_7b8 [24];
  uint auStack_7a0 [2];
  undefined1 local_798 [16];
  uint local_788 [3];
  undefined3 uStack_77b;
  int iStack_778;
  bool bStack_774;
  undefined8 local_770;
  undefined1 local_768 [24];
  uint auStack_750 [2];
  undefined1 local_748 [16];
  uint local_738 [3];
  undefined3 uStack_72b;
  int iStack_728;
  bool bStack_724;
  undefined8 local_720;
  undefined1 local_718 [24];
  uint auStack_700 [2];
  undefined1 local_6f8 [16];
  uint local_6e8 [3];
  undefined3 uStack_6db;
  int iStack_6d8;
  bool bStack_6d4;
  undefined8 local_6d0;
  undefined1 local_6c8 [24];
  uint auStack_6b0 [2];
  undefined1 local_6a8 [16];
  uint local_698 [3];
  undefined3 uStack_68b;
  int iStack_688;
  bool bStack_684;
  undefined8 local_680;
  undefined1 local_678 [24];
  uint auStack_660 [2];
  undefined1 local_658 [16];
  uint local_648 [3];
  undefined3 uStack_63b;
  int iStack_638;
  bool bStack_634;
  undefined8 local_630;
  undefined1 local_628 [24];
  uint auStack_610 [2];
  undefined1 local_608 [16];
  uint local_5f8 [3];
  undefined3 uStack_5eb;
  int iStack_5e8;
  bool bStack_5e4;
  undefined8 local_5e0;
  undefined1 local_5d8 [24];
  uint auStack_5c0 [2];
  undefined1 local_5b8 [16];
  uint local_5a8 [3];
  undefined3 uStack_59b;
  int iStack_598;
  bool bStack_594;
  undefined8 local_590;
  undefined1 local_588 [24];
  uint auStack_570 [2];
  undefined1 local_568 [16];
  uint local_558 [3];
  undefined3 uStack_54b;
  int iStack_548;
  bool bStack_544;
  undefined8 local_540;
  undefined1 local_538 [24];
  uint auStack_520 [2];
  undefined1 local_518 [16];
  uint local_508 [3];
  undefined3 uStack_4fb;
  int iStack_4f8;
  bool bStack_4f4;
  undefined8 local_4f0;
  undefined1 local_4e8 [24];
  uint auStack_4d0 [2];
  undefined1 local_4c8 [16];
  uint local_4b8 [3];
  undefined3 uStack_4ab;
  int iStack_4a8;
  bool bStack_4a4;
  undefined8 local_4a0;
  undefined1 local_498 [24];
  uint auStack_480 [2];
  undefined1 local_478 [16];
  uint local_468 [3];
  undefined3 uStack_45b;
  int iStack_458;
  bool bStack_454;
  undefined8 local_450;
  cpp_dec_float<100U,_int,_void> local_448;
  cpp_dec_float<100U,_int,_void> local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  cpp_dec_float<100U,_int,_void> local_358;
  cpp_dec_float<100U,_int,_void> local_308;
  cpp_dec_float<100U,_int,_void> local_2b8;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_998.fpclass = cpp_dec_float_finite;
  local_998.prec_elem = 0x10;
  local_998.data._M_elems[0] = 0;
  local_998.data._M_elems[1] = 0;
  local_998.data._M_elems[2] = 0;
  local_998.data._M_elems[3] = 0;
  local_998.data._M_elems[4] = 0;
  local_998.data._M_elems[5] = 0;
  local_998.data._M_elems[6] = 0;
  local_998.data._M_elems[7] = 0;
  local_998.data._M_elems[8] = 0;
  local_998.data._M_elems[9] = 0;
  local_998.data._M_elems[10] = 0;
  local_998.data._M_elems[0xb] = 0;
  local_998.data._M_elems[0xc] = 0;
  local_998.data._M_elems[0xd] = 0;
  local_998.data._M_elems._56_5_ = 0;
  uVar16 = 0;
  local_998.data._M_elems[0xf]._1_3_ = 0;
  local_998.exp = 0;
  local_998.neg = false;
  local_9f8.fpclass = cpp_dec_float_finite;
  local_9f8.prec_elem = 0x10;
  local_9f8.data._M_elems[0] = 0;
  local_9f8.data._M_elems[1] = 0;
  local_9f8.data._M_elems[2] = 0;
  local_9f8.data._M_elems[3] = 0;
  local_9f8.data._M_elems[4] = 0;
  local_9f8.data._M_elems[5] = 0;
  local_9f8.data._M_elems[6] = 0;
  local_9f8.data._M_elems[7] = 0;
  local_9f8.data._M_elems[8] = 0;
  local_9f8.data._M_elems[9] = 0;
  local_9f8.data._M_elems[10] = 0;
  local_9f8.data._M_elems[0xb] = 0;
  local_9f8.data._M_elems[0xc] = 0;
  local_9f8.data._M_elems[0xd] = 0;
  local_9f8.data._M_elems._56_5_ = 0;
  local_9f8.data._M_elems[0xf]._1_3_ = 0;
  local_9f8.exp = 0;
  local_9f8.neg = false;
  local_a68.fpclass = cpp_dec_float_finite;
  local_a68.prec_elem = 0x10;
  local_a68.data._M_elems[0] = 0;
  local_a68.data._M_elems[1] = 0;
  local_a68.data._M_elems[2] = 0;
  local_a68.data._M_elems[3] = 0;
  local_a68.data._M_elems[4] = 0;
  local_a68.data._M_elems[5] = 0;
  local_a68.data._M_elems[6] = 0;
  local_a68.data._M_elems[7] = 0;
  local_a68.data._M_elems[8] = 0;
  local_a68.data._M_elems[9] = 0;
  local_a68.data._M_elems[10] = 0;
  local_a68.data._M_elems[0xb] = 0;
  local_a68.data._M_elems[0xc] = 0;
  local_a68.data._M_elems[0xd] = 0;
  local_a68.data._M_elems._56_5_ = 0;
  local_a68.data._M_elems[0xf]._1_3_ = 0;
  local_a68.exp = 0;
  local_a68.neg = false;
  local_928 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_930 = (this->l).idx;
  local_910 = (this->l).row;
  local_a70 = (this->l).start;
  local_920 = (ulong)(this->l).firstUpdate;
  local_a10 = vec;
  local_a08 = vec2;
  local_940 = ridx;
  local_938 = rn;
  local_908 = eps;
  if (0 < (long)local_920) {
    lVar23 = 0;
    local_900 = this;
    do {
      iVar17 = local_910[lVar23];
      local_998.data._M_elems._0_8_ = *(undefined8 *)local_a10[iVar17].m_backend.data._M_elems;
      local_998.data._M_elems._8_8_ = *(undefined8 *)(local_a10[iVar17].m_backend.data._M_elems + 2)
      ;
      puVar1 = local_a10[iVar17].m_backend.data._M_elems + 4;
      local_998.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_998.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_a10[iVar17].m_backend.data._M_elems + 8;
      local_998.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_998.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_a10[iVar17].m_backend.data._M_elems + 0xc;
      local_998.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_998.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_998.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      iStack_a88 = local_a10[iVar17].m_backend.exp;
      local_998.neg = local_a10[iVar17].m_backend.neg;
      local_998.fpclass = local_a10[iVar17].m_backend.fpclass;
      local_998.prec_elem = local_a10[iVar17].m_backend.prec_elem;
      local_9f8.data._M_elems._0_8_ = *(undefined8 *)local_a08[iVar17].m_backend.data._M_elems;
      local_9f8.data._M_elems._8_8_ = *(undefined8 *)(local_a08[iVar17].m_backend.data._M_elems + 2)
      ;
      puVar1 = local_a08[iVar17].m_backend.data._M_elems + 4;
      local_9f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_9f8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_a08[iVar17].m_backend.data._M_elems + 8;
      local_9f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_9f8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_a08[iVar17].m_backend.data._M_elems + 0xc;
      local_9f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_9f8.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_9f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_9f8.exp = local_a08[iVar17].m_backend.exp;
      local_9f8.neg = local_a08[iVar17].m_backend.neg;
      local_9f8.fpclass = local_a08[iVar17].m_backend.fpclass;
      local_9f8.prec_elem = local_a08[iVar17].m_backend.prec_elem;
      local_a68.data._M_elems._0_8_ = *(undefined8 *)vec3[iVar17].m_backend.data._M_elems;
      local_a68.data._M_elems._8_8_ = *(undefined8 *)(vec3[iVar17].m_backend.data._M_elems + 2);
      puVar1 = vec3[iVar17].m_backend.data._M_elems + 4;
      local_a68.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a68.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec3[iVar17].m_backend.data._M_elems + 8;
      local_a68.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_a68.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = vec3[iVar17].m_backend.data._M_elems + 0xc;
      local_a68.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_a68.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_a68.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_a68.exp = vec3[iVar17].m_backend.exp;
      local_a68.neg = vec3[iVar17].m_backend.neg;
      local_a68.fpclass = vec3[iVar17].m_backend.fpclass;
      local_a68.prec_elem = vec3[iVar17].m_backend.prec_elem;
      local_ac8._0_8_ = *(undefined8 *)local_a10[iVar17].m_backend.data._M_elems;
      local_ac8._8_8_ = *(undefined8 *)(local_a10[iVar17].m_backend.data._M_elems + 2);
      puVar1 = local_a10[iVar17].m_backend.data._M_elems + 4;
      local_ab8._0_8_ = *(undefined8 *)puVar1;
      local_ab8._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_a10[iVar17].m_backend.data._M_elems + 8;
      local_aa8._0_8_ = *(undefined8 *)puVar1;
      local_aa8._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = local_a10[iVar17].m_backend.data._M_elems + 0xc;
      local_a98._0_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      stack0xfffffffffffff570 = (undefined5)uVar4;
      uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
      local_88.data._M_elems._0_8_ = *(undefined8 *)(local_908->m_backend).data._M_elems;
      local_88.data._M_elems._8_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 2);
      local_88.data._M_elems._16_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 4);
      local_88.data._M_elems._24_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 6);
      local_88.data._M_elems._32_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 8);
      local_88.data._M_elems._40_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 10);
      local_88.data._M_elems._48_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 0xc);
      local_88.data._M_elems._56_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 0xe);
      local_88.exp = (local_908->m_backend).exp;
      local_88.neg = (local_908->m_backend).neg;
      local_88.fpclass = (local_908->m_backend).fpclass;
      local_88.prec_elem = (local_908->m_backend).prec_elem;
      local_a80._4_4_ = local_998.prec_elem;
      local_a80._0_4_ = local_998.fpclass;
      bStack_a84 = local_998.neg;
      if ((local_998.neg == true) &&
         (local_ac8._0_4_ != 0 || local_998.fpclass != cpp_dec_float_finite)) {
        bStack_a84 = false;
      }
      local_9a0 = lVar23;
      local_998.exp = iStack_a88;
      if (local_88.fpclass == cpp_dec_float_NaN || local_998.fpclass == cpp_dec_float_NaN) {
        iVar17 = (eps2->m_backend).exp;
        fVar26 = (eps2->m_backend).fpclass;
        iVar27 = (eps2->m_backend).prec_elem;
        local_a80._0_4_ = local_9f8.fpclass;
        local_a80._4_4_ = local_9f8.prec_elem;
        uVar2 = (eps2->m_backend).neg;
LAB_003f1d4b:
        local_3a8.neg = (bool)uVar2;
        local_a98[0] = local_9f8.data._M_elems[0xc];
        local_a98[1] = local_9f8.data._M_elems[0xd];
        stack0xfffffffffffff570 = local_9f8.data._M_elems._56_5_;
        uStack_a8b = local_9f8.data._M_elems[0xf]._1_3_;
        local_aa8._0_4_ = local_9f8.data._M_elems[8];
        local_aa8._4_4_ = local_9f8.data._M_elems[9];
        local_aa8._8_4_ = local_9f8.data._M_elems[10];
        local_aa8._12_4_ = local_9f8.data._M_elems[0xb];
        local_ab8._0_4_ = local_9f8.data._M_elems[4];
        local_ab8._4_4_ = local_9f8.data._M_elems[5];
        local_ab8._8_4_ = local_9f8.data._M_elems[6];
        local_ab8._12_4_ = local_9f8.data._M_elems[7];
        local_ac8._0_4_ = local_9f8.data._M_elems[0];
        local_ac8._4_4_ = local_9f8.data._M_elems[1];
        uVar4 = local_ac8._0_8_;
        local_ac8._8_4_ = local_9f8.data._M_elems[2];
        local_ac8._12_4_ = local_9f8.data._M_elems[3];
        local_3a8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_3a8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_3a8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_3a8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_3a8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_3a8.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
        local_3a8.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
        local_3a8.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
        bStack_a84 = local_9f8.neg;
        if (((local_9f8.neg & 1U) != 0) &&
           (local_ac8._0_4_ = local_9f8.data._M_elems[0],
           local_ac8._0_4_ != 0 || (fpclass_type)local_a80 != cpp_dec_float_finite)) {
          bStack_a84 = (bool)(local_9f8.neg ^ 1);
        }
        local_3a8.exp = iVar17;
        local_3a8.fpclass = fVar26;
        local_3a8.prec_elem = iVar27;
        if (fVar26 == cpp_dec_float_NaN || (fpclass_type)local_a80 == cpp_dec_float_NaN) {
          iVar17 = (eps3->m_backend).exp;
          fVar26 = (eps3->m_backend).fpclass;
          uVar2 = (eps3->m_backend).neg;
          iVar27 = (eps3->m_backend).prec_elem;
        }
        else {
          iStack_a88 = local_9f8.exp;
          local_ac8._0_8_ = uVar4;
          iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)local_ac8,&local_3a8);
          fVar7 = local_a68.fpclass;
          iVar17 = (eps3->m_backend).exp;
          uVar2 = (eps3->m_backend).neg;
          fVar26 = (eps3->m_backend).fpclass;
          iVar27 = (eps3->m_backend).prec_elem;
          if (0 < iVar22) {
            local_a78 = (ulong)local_a70[lVar23];
            local_a98[0] = local_a68.data._M_elems[0xc];
            local_a98[1] = local_a68.data._M_elems[0xd];
            stack0xfffffffffffff570 = local_a68.data._M_elems._56_5_;
            uStack_a8b = local_a68.data._M_elems[0xf]._1_3_;
            local_aa8._8_4_ = local_a68.data._M_elems[10];
            local_aa8._12_4_ = local_a68.data._M_elems[0xb];
            local_aa8._0_4_ = local_a68.data._M_elems[8];
            local_aa8._4_4_ = local_a68.data._M_elems[9];
            local_ab8._8_4_ = local_a68.data._M_elems[6];
            local_ab8._12_4_ = local_a68.data._M_elems[7];
            local_ab8._0_4_ = local_a68.data._M_elems[4];
            local_ab8._4_4_ = local_a68.data._M_elems[5];
            local_ac8._8_4_ = local_a68.data._M_elems[2];
            local_ac8._12_4_ = local_a68.data._M_elems[3];
            local_ac8._0_4_ = local_a68.data._M_elems[0];
            local_ac8._4_4_ = local_a68.data._M_elems[1];
            auVar5 = local_ac8;
            local_3f8.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
            local_3f8.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
            local_3f8.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
            local_3f8.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
            local_3f8.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
            local_3f8.data._M_elems._40_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
            local_3f8.data._M_elems._48_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
            local_3f8.data._M_elems._56_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
            iStack_a88 = local_a68.exp;
            bStack_a84 = local_a68.neg;
            local_a80._0_4_ = local_a68.fpclass;
            local_a80._4_4_ = local_a68.prec_elem;
            if (((local_a68.neg & 1U) != 0) &&
               (local_ac8._0_4_ = local_a68.data._M_elems[0],
               local_ac8._0_4_ != 0 || fVar7 != cpp_dec_float_finite)) {
              bStack_a84 = (bool)(local_a68.neg ^ 1);
            }
            piVar24 = local_930 + local_a78;
            pcVar25 = &local_928[local_a78].m_backend;
            local_ac8 = auVar5;
            local_3f8.exp = iVar17;
            local_3f8.neg = (bool)uVar2;
            local_3f8.fpclass = fVar26;
            local_3f8.prec_elem = iVar27;
            if ((fVar26 == cpp_dec_float_NaN || fVar7 == cpp_dec_float_NaN) ||
               (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   ((cpp_dec_float<100U,_int,_void> *)local_ac8,&local_3f8),
               iVar17 < 1)) {
              for (iVar17 = local_a70[lVar23 + 1]; (int)local_a78 < iVar17; iVar17 = iVar17 + -1) {
                iVar22 = *piVar24;
                local_810._0_4_ = cpp_dec_float_finite;
                local_810._4_4_ = 0x10;
                local_858._0_16_ = (undefined1  [16])0x0;
                stack0xfffffffffffff7b8 = (undefined1  [16])0x0;
                local_838 = (undefined1  [16])0x0;
                local_828[0] = 0;
                local_828[1] = 0;
                stack0xfffffffffffff7e0 = 0;
                uStack_81b = 0;
                iStack_818 = 0;
                bStack_814 = false;
                pcVar21 = &local_9f8;
                if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_858) {
                  local_828[0] = local_9f8.data._M_elems[0xc];
                  local_828[1] = local_9f8.data._M_elems[0xd];
                  stack0xfffffffffffff7e0 = local_9f8.data._M_elems._56_5_;
                  uStack_81b = local_9f8.data._M_elems[0xf]._1_3_;
                  local_838._8_4_ = local_9f8.data._M_elems[10];
                  local_838._12_4_ = local_9f8.data._M_elems[0xb];
                  local_838._0_4_ = local_9f8.data._M_elems[8];
                  local_838._4_4_ = local_9f8.data._M_elems[9];
                  auStack_840[0] = local_9f8.data._M_elems[6];
                  auStack_840[1] = local_9f8.data._M_elems[7];
                  local_858._16_4_ = local_9f8.data._M_elems[4];
                  local_858._20_4_ = local_9f8.data._M_elems[5];
                  local_858._8_4_ = local_9f8.data._M_elems[2];
                  local_858._12_4_ = local_9f8.data._M_elems[3];
                  local_858._0_4_ = local_9f8.data._M_elems[0];
                  local_858._4_4_ = local_9f8.data._M_elems[1];
                  iStack_818 = local_9f8.exp;
                  bStack_814 = local_9f8.neg;
                  local_810._0_4_ = local_9f8.fpclass;
                  local_810._4_4_ = local_9f8.prec_elem;
                  pcVar21 = pcVar25;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                          ((cpp_dec_float<100U,_int,_void> *)local_858,pcVar21);
                pcVar21 = &local_a08[iVar22].m_backend;
                if (local_a08[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                  local_a80._0_4_ = cpp_dec_float_finite;
                  local_a80._4_4_ = 0x10;
                  local_ac8 = (undefined1  [16])0x0;
                  local_ab8 = (undefined1  [16])0x0;
                  local_aa8 = (undefined1  [16])0x0;
                  local_a98[0] = 0;
                  local_a98[1] = 0;
                  stack0xfffffffffffff570 = 0;
                  uStack_a8b = 0;
                  iStack_a88 = 0;
                  bStack_a84 = false;
                  pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                  local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                  local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                  local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                  local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  stack0xfffffffffffff570 = (undefined5)uVar4;
                  uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                  iStack_a88 = pcVar20->exp;
                  bStack_a84 = pcVar20->neg;
                  local_a80._0_4_ = pcVar20->fpclass;
                  local_a80._4_4_ = pcVar20->prec_elem;
                  iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                  if (iVar19 == 0) {
                    ridx2[*rn2] = iVar22;
                    *rn2 = *rn2 + 1;
                  }
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_858);
                if (pcVar21->fpclass != cpp_dec_float_NaN) {
                  local_a80._0_4_ = cpp_dec_float_finite;
                  local_a80._4_4_ = 0x10;
                  local_ac8 = (undefined1  [16])0x0;
                  local_ab8 = (undefined1  [16])0x0;
                  local_aa8 = (undefined1  [16])0x0;
                  local_a98[0] = 0;
                  local_a98[1] = 0;
                  stack0xfffffffffffff570 = 0;
                  uStack_a8b = 0;
                  iStack_a88 = 0;
                  bStack_a84 = false;
                  pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                  local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                  local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                  local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                  local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  stack0xfffffffffffff570 = (undefined5)uVar4;
                  uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                  iStack_a88 = pcVar20->exp;
                  bStack_a84 = pcVar20->neg;
                  local_a80._0_4_ = pcVar20->fpclass;
                  local_a80._4_4_ = pcVar20->prec_elem;
                  iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                  if (iVar22 == 0) {
                    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                              ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                  }
                }
                piVar24 = piVar24 + 1;
                pcVar25 = pcVar25 + 1;
              }
            }
            else {
              for (iVar17 = local_a70[lVar23 + 1]; (int)local_a78 < iVar17; iVar17 = iVar17 + -1) {
                iVar22 = *piVar24;
                local_770._0_4_ = cpp_dec_float_finite;
                local_770._4_4_ = 0x10;
                local_7b8._0_16_ = (undefined1  [16])0x0;
                stack0xfffffffffffff858 = (undefined1  [16])0x0;
                local_798 = (undefined1  [16])0x0;
                local_788[0] = 0;
                local_788[1] = 0;
                stack0xfffffffffffff880 = 0;
                uStack_77b = 0;
                iStack_778 = 0;
                bStack_774 = false;
                pcVar21 = &local_9f8;
                if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_7b8) {
                  local_788[0] = local_9f8.data._M_elems[0xc];
                  local_788[1] = local_9f8.data._M_elems[0xd];
                  stack0xfffffffffffff880 = local_9f8.data._M_elems._56_5_;
                  uStack_77b = local_9f8.data._M_elems[0xf]._1_3_;
                  local_798._8_4_ = local_9f8.data._M_elems[10];
                  local_798._12_4_ = local_9f8.data._M_elems[0xb];
                  local_798._0_4_ = local_9f8.data._M_elems[8];
                  local_798._4_4_ = local_9f8.data._M_elems[9];
                  auStack_7a0[0] = local_9f8.data._M_elems[6];
                  auStack_7a0[1] = local_9f8.data._M_elems[7];
                  local_7b8._16_4_ = local_9f8.data._M_elems[4];
                  local_7b8._20_4_ = local_9f8.data._M_elems[5];
                  local_7b8._8_4_ = local_9f8.data._M_elems[2];
                  local_7b8._12_4_ = local_9f8.data._M_elems[3];
                  local_7b8._0_4_ = local_9f8.data._M_elems[0];
                  local_7b8._4_4_ = local_9f8.data._M_elems[1];
                  iStack_778 = local_9f8.exp;
                  bStack_774 = local_9f8.neg;
                  local_770._0_4_ = local_9f8.fpclass;
                  local_770._4_4_ = local_9f8.prec_elem;
                  pcVar21 = pcVar25;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                          ((cpp_dec_float<100U,_int,_void> *)local_7b8,pcVar21);
                pcVar21 = &local_a08[iVar22].m_backend;
                if (local_a08[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                  local_a80._0_4_ = cpp_dec_float_finite;
                  local_a80._4_4_ = 0x10;
                  local_ac8 = (undefined1  [16])0x0;
                  local_ab8 = (undefined1  [16])0x0;
                  local_aa8 = (undefined1  [16])0x0;
                  local_a98[0] = 0;
                  local_a98[1] = 0;
                  stack0xfffffffffffff570 = 0;
                  uStack_a8b = 0;
                  iStack_a88 = 0;
                  bStack_a84 = false;
                  pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                  local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                  local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                  local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                  local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  stack0xfffffffffffff570 = (undefined5)uVar4;
                  uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                  iStack_a88 = pcVar20->exp;
                  bStack_a84 = pcVar20->neg;
                  local_a80._0_4_ = pcVar20->fpclass;
                  local_a80._4_4_ = pcVar20->prec_elem;
                  iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                  if (iVar19 == 0) {
                    ridx2[*rn2] = iVar22;
                    *rn2 = *rn2 + 1;
                  }
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_7b8);
                if (pcVar21->fpclass != cpp_dec_float_NaN) {
                  local_a80._0_4_ = cpp_dec_float_finite;
                  local_a80._4_4_ = 0x10;
                  local_ac8 = (undefined1  [16])0x0;
                  local_ab8 = (undefined1  [16])0x0;
                  local_aa8 = (undefined1  [16])0x0;
                  local_a98[0] = 0;
                  local_a98[1] = 0;
                  stack0xfffffffffffff570 = 0;
                  uStack_a8b = 0;
                  iStack_a88 = 0;
                  bStack_a84 = false;
                  pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                  local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                  local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                  local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                  local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  stack0xfffffffffffff570 = (undefined5)uVar4;
                  uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                  iStack_a88 = pcVar20->exp;
                  bStack_a84 = pcVar20->neg;
                  local_a80._0_4_ = pcVar20->fpclass;
                  local_a80._4_4_ = pcVar20->prec_elem;
                  iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                  if (iVar19 == 0) {
                    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                              ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                  }
                }
                local_7c0._0_4_ = cpp_dec_float_finite;
                local_7c0._4_4_ = 0x10;
                local_808._0_16_ = (undefined1  [16])0x0;
                stack0xfffffffffffff808 = (undefined1  [16])0x0;
                local_7e8 = (undefined1  [16])0x0;
                local_7d8[0] = 0;
                local_7d8[1] = 0;
                stack0xfffffffffffff830 = 0;
                uStack_7cb = 0;
                iStack_7c8 = 0;
                bStack_7c4 = false;
                pcVar21 = &local_a68;
                if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_808) {
                  local_7d8[0] = local_a68.data._M_elems[0xc];
                  local_7d8[1] = local_a68.data._M_elems[0xd];
                  stack0xfffffffffffff830 = local_a68.data._M_elems._56_5_;
                  uStack_7cb = local_a68.data._M_elems[0xf]._1_3_;
                  local_7e8._8_4_ = local_a68.data._M_elems[10];
                  local_7e8._12_4_ = local_a68.data._M_elems[0xb];
                  local_7e8._0_4_ = local_a68.data._M_elems[8];
                  local_7e8._4_4_ = local_a68.data._M_elems[9];
                  auStack_7f0[0] = local_a68.data._M_elems[6];
                  auStack_7f0[1] = local_a68.data._M_elems[7];
                  local_808._16_4_ = local_a68.data._M_elems[4];
                  local_808._20_4_ = local_a68.data._M_elems[5];
                  local_808._8_4_ = local_a68.data._M_elems[2];
                  local_808._12_4_ = local_a68.data._M_elems[3];
                  local_808._0_4_ = local_a68.data._M_elems[0];
                  local_808._4_4_ = local_a68.data._M_elems[1];
                  iStack_7c8 = local_a68.exp;
                  bStack_7c4 = local_a68.neg;
                  local_7c0._0_4_ = local_a68.fpclass;
                  local_7c0._4_4_ = local_a68.prec_elem;
                  pcVar21 = pcVar25;
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                          ((cpp_dec_float<100U,_int,_void> *)local_808,pcVar21);
                pcVar21 = &vec3[iVar22].m_backend;
                if (vec3[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                  local_a80._0_4_ = cpp_dec_float_finite;
                  local_a80._4_4_ = 0x10;
                  local_ac8 = (undefined1  [16])0x0;
                  local_ab8 = (undefined1  [16])0x0;
                  local_aa8 = (undefined1  [16])0x0;
                  local_a98[0] = 0;
                  local_a98[1] = 0;
                  stack0xfffffffffffff570 = 0;
                  uStack_a8b = 0;
                  iStack_a88 = 0;
                  bStack_a84 = false;
                  pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                  local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                  local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                  local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                  local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  stack0xfffffffffffff570 = (undefined5)uVar4;
                  uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                  iStack_a88 = pcVar20->exp;
                  bStack_a84 = pcVar20->neg;
                  local_a80._0_4_ = pcVar20->fpclass;
                  local_a80._4_4_ = pcVar20->prec_elem;
                  iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                  if (iVar19 == 0) {
                    ridx3[*rn3] = iVar22;
                    *rn3 = *rn3 + 1;
                  }
                }
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_808);
                if (pcVar21->fpclass != cpp_dec_float_NaN) {
                  local_a80._0_4_ = cpp_dec_float_finite;
                  local_a80._4_4_ = 0x10;
                  local_ac8 = (undefined1  [16])0x0;
                  local_ab8 = (undefined1  [16])0x0;
                  local_aa8 = (undefined1  [16])0x0;
                  local_a98[0] = 0;
                  local_a98[1] = 0;
                  stack0xfffffffffffff570 = 0;
                  uStack_a8b = 0;
                  iStack_a88 = 0;
                  bStack_a84 = false;
                  pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                  local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                  local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                  local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                  local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                  uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                  stack0xfffffffffffff570 = (undefined5)uVar4;
                  uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                  iStack_a88 = pcVar20->exp;
                  bStack_a84 = pcVar20->neg;
                  local_a80._0_4_ = pcVar20->fpclass;
                  local_a80._4_4_ = pcVar20->prec_elem;
                  iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                     (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                  if (iVar22 == 0) {
                    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                              ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                  }
                }
                piVar24 = piVar24 + 1;
                pcVar25 = pcVar25 + 1;
              }
            }
            goto LAB_003f275c;
          }
        }
        local_448.prec_elem = iVar27;
        local_448.neg = (bool)uVar2;
        local_a98[0] = local_a68.data._M_elems[0xc];
        local_a98[1] = local_a68.data._M_elems[0xd];
        stack0xfffffffffffff570 = local_a68.data._M_elems._56_5_;
        uStack_a8b = local_a68.data._M_elems[0xf]._1_3_;
        local_aa8._8_4_ = local_a68.data._M_elems[10];
        local_aa8._12_4_ = local_a68.data._M_elems[0xb];
        local_aa8._0_4_ = local_a68.data._M_elems[8];
        local_aa8._4_4_ = local_a68.data._M_elems[9];
        local_ab8._8_4_ = local_a68.data._M_elems[6];
        local_ab8._12_4_ = local_a68.data._M_elems[7];
        local_ab8._0_4_ = local_a68.data._M_elems[4];
        local_ab8._4_4_ = local_a68.data._M_elems[5];
        local_ac8._8_4_ = local_a68.data._M_elems[2];
        local_ac8._12_4_ = local_a68.data._M_elems[3];
        local_ac8._0_4_ = local_a68.data._M_elems[0];
        local_ac8._4_4_ = local_a68.data._M_elems[1];
        auVar5 = local_ac8;
        local_448.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
        local_448.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
        local_448.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
        local_448.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
        local_448.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
        local_448.data._M_elems._40_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
        local_448.data._M_elems._48_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
        local_448.data._M_elems._56_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
        iStack_a88 = local_a68.exp;
        bStack_a84 = local_a68.neg;
        local_a80._4_4_ = local_a68.prec_elem;
        local_a80._0_4_ = local_a68.fpclass;
        if (((local_a68.neg & 1U) != 0) &&
           (local_ac8._0_4_ = local_a68.data._M_elems[0],
           local_ac8._0_4_ != 0 || local_a68.fpclass != cpp_dec_float_finite)) {
          bStack_a84 = (bool)(local_a68.neg ^ 1);
        }
        local_448.exp = iVar17;
        local_448.fpclass = fVar26;
        if ((fVar26 != cpp_dec_float_NaN && local_a68.fpclass != cpp_dec_float_NaN) &&
           (local_ac8 = auVar5,
           iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)local_ac8,&local_448), 0 < iVar17))
        {
          iVar17 = local_a70[local_9a0];
          iVar22 = local_a70[local_9a0 + 1];
          if (iVar17 < iVar22) {
            pcVar25 = &local_928[iVar17].m_backend;
            piVar24 = local_930 + iVar17;
            do {
              iVar19 = *piVar24;
              local_860._0_4_ = cpp_dec_float_finite;
              local_860._4_4_ = 0x10;
              local_8a8._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff768 = (undefined1  [16])0x0;
              local_888 = (undefined1  [16])0x0;
              local_878[0] = 0;
              local_878[1] = 0;
              stack0xfffffffffffff790 = 0;
              uStack_86b = 0;
              iStack_868 = 0;
              bStack_864 = false;
              pcVar21 = &local_a68;
              if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_8a8) {
                local_878[0] = local_a68.data._M_elems[0xc];
                local_878[1] = local_a68.data._M_elems[0xd];
                stack0xfffffffffffff790 = local_a68.data._M_elems._56_5_;
                uStack_86b = local_a68.data._M_elems[0xf]._1_3_;
                local_888._8_4_ = local_a68.data._M_elems[10];
                local_888._12_4_ = local_a68.data._M_elems[0xb];
                local_888._0_4_ = local_a68.data._M_elems[8];
                local_888._4_4_ = local_a68.data._M_elems[9];
                auStack_890[0] = local_a68.data._M_elems[6];
                auStack_890[1] = local_a68.data._M_elems[7];
                local_8a8._16_4_ = local_a68.data._M_elems[4];
                local_8a8._20_4_ = local_a68.data._M_elems[5];
                local_8a8._8_4_ = local_a68.data._M_elems[2];
                local_8a8._12_4_ = local_a68.data._M_elems[3];
                local_8a8._0_4_ = local_a68.data._M_elems[0];
                local_8a8._4_4_ = local_a68.data._M_elems[1];
                iStack_868 = local_a68.exp;
                bStack_864 = local_a68.neg;
                local_860._0_4_ = local_a68.fpclass;
                local_860._4_4_ = local_a68.prec_elem;
                pcVar21 = pcVar25;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_8a8,pcVar21);
              pcVar21 = &vec3[iVar19].m_backend;
              if (vec3[iVar19].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar18 == 0) {
                  ridx3[*rn3] = iVar19;
                  *rn3 = *rn3 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_8a8);
              if (pcVar21->fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar19 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                }
              }
              piVar24 = piVar24 + 1;
              pcVar25 = pcVar25 + 1;
              iVar22 = iVar22 + -1;
            } while (iVar17 < iVar22);
          }
        }
      }
      else {
        iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           ((cpp_dec_float<100U,_int,_void> *)local_ac8,&local_88);
        fVar7 = local_9f8.fpclass;
        iVar17 = (eps2->m_backend).exp;
        uVar2 = (eps2->m_backend).neg;
        fVar26 = (eps2->m_backend).fpclass;
        iVar27 = (eps2->m_backend).prec_elem;
        local_a80._0_4_ = local_9f8.fpclass;
        local_a80._4_4_ = local_9f8.prec_elem;
        if (iVar22 < 1) goto LAB_003f1d4b;
        local_a78 = (ulong)local_a70[lVar23];
        local_a98[0] = local_9f8.data._M_elems[0xc];
        local_a98[1] = local_9f8.data._M_elems[0xd];
        stack0xfffffffffffff570 = local_9f8.data._M_elems._56_5_;
        uStack_a8b = local_9f8.data._M_elems[0xf]._1_3_;
        local_aa8._0_4_ = local_9f8.data._M_elems[8];
        local_aa8._4_4_ = local_9f8.data._M_elems[9];
        local_aa8._8_4_ = local_9f8.data._M_elems[10];
        local_aa8._12_4_ = local_9f8.data._M_elems[0xb];
        local_ab8._0_4_ = local_9f8.data._M_elems[4];
        local_ab8._4_4_ = local_9f8.data._M_elems[5];
        local_ab8._8_4_ = local_9f8.data._M_elems[6];
        local_ab8._12_4_ = local_9f8.data._M_elems[7];
        local_ac8._0_4_ = local_9f8.data._M_elems[0];
        local_ac8._4_4_ = local_9f8.data._M_elems[1];
        uVar4 = local_ac8._0_8_;
        local_ac8._8_4_ = local_9f8.data._M_elems[2];
        local_ac8._12_4_ = local_9f8.data._M_elems[3];
        local_358.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_358.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_358.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_358.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_358.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_358.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
        local_358.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
        local_358.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
        iStack_a88 = local_9f8.exp;
        bStack_a84 = local_9f8.neg;
        local_a80._0_4_ = local_9f8.fpclass;
        local_a80._4_4_ = local_9f8.prec_elem;
        if (((local_9f8.neg & 1U) != 0) &&
           (local_ac8._0_4_ = local_9f8.data._M_elems[0],
           local_ac8._0_4_ != 0 || fVar7 != cpp_dec_float_finite)) {
          bStack_a84 = (bool)(local_9f8.neg ^ 1);
        }
        piVar24 = local_930 + local_a78;
        pcVar25 = &local_928[local_a78].m_backend;
        local_358.exp = iVar17;
        local_358.neg = (bool)uVar2;
        local_358.fpclass = fVar26;
        local_358.prec_elem = iVar27;
        if ((fVar26 == cpp_dec_float_NaN || fVar7 == cpp_dec_float_NaN) ||
           (local_ac8._0_8_ = uVar4,
           iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)local_ac8,&local_358), iVar17 < 1))
        {
          local_a98[0] = local_a68.data._M_elems[0xc];
          local_a98[1] = local_a68.data._M_elems[0xd];
          stack0xfffffffffffff570 = local_a68.data._M_elems._56_5_;
          uStack_a8b = local_a68.data._M_elems[0xf]._1_3_;
          local_aa8._8_4_ = local_a68.data._M_elems[10];
          local_aa8._12_4_ = local_a68.data._M_elems[0xb];
          local_aa8._0_4_ = local_a68.data._M_elems[8];
          local_aa8._4_4_ = local_a68.data._M_elems[9];
          local_ab8._8_4_ = local_a68.data._M_elems[6];
          local_ab8._12_4_ = local_a68.data._M_elems[7];
          local_ab8._0_4_ = local_a68.data._M_elems[4];
          local_ab8._4_4_ = local_a68.data._M_elems[5];
          local_ac8._8_4_ = local_a68.data._M_elems[2];
          local_ac8._12_4_ = local_a68.data._M_elems[3];
          local_ac8._0_4_ = local_a68.data._M_elems[0];
          local_ac8._4_4_ = local_a68.data._M_elems[1];
          auVar5 = local_ac8;
          local_128.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
          local_128.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
          local_128.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
          local_128.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
          local_128.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
          local_128.data._M_elems._40_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
          local_128.data._M_elems._48_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
          local_128.data._M_elems._56_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
          local_128.exp = (eps3->m_backend).exp;
          local_128.neg = (eps3->m_backend).neg;
          local_128.fpclass = (eps3->m_backend).fpclass;
          local_128.prec_elem = (eps3->m_backend).prec_elem;
          iStack_a88 = local_a68.exp;
          bStack_a84 = local_a68.neg;
          local_a80._0_4_ = local_a68.fpclass;
          local_a80._4_4_ = local_a68.prec_elem;
          if ((local_a68.neg == true) &&
             (local_ac8._0_4_ = local_a68.data._M_elems[0],
             local_ac8._0_4_ != 0 || local_a68.fpclass != cpp_dec_float_finite)) {
            bStack_a84 = false;
          }
          local_ac8 = auVar5;
          if ((local_128.fpclass == cpp_dec_float_NaN || local_a68.fpclass == cpp_dec_float_NaN) ||
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_ac8,&local_128),
             iVar17 < 1)) {
            for (iVar17 = local_a70[lVar23 + 1]; (int)local_a78 < iVar17; iVar17 = iVar17 + -1) {
              iVar22 = *piVar24;
              local_720._0_4_ = cpp_dec_float_finite;
              local_720._4_4_ = 0x10;
              local_768._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff8a8 = (undefined1  [16])0x0;
              local_748 = (undefined1  [16])0x0;
              local_738[0] = 0;
              local_738[1] = 0;
              stack0xfffffffffffff8d0 = 0;
              uStack_72b = 0;
              iStack_728 = 0;
              bStack_724 = false;
              pcVar21 = &local_998;
              if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_768) {
                local_738[0] = local_998.data._M_elems[0xc];
                local_738[1] = local_998.data._M_elems[0xd];
                stack0xfffffffffffff8d0 = local_998.data._M_elems._56_5_;
                uStack_72b = local_998.data._M_elems[0xf]._1_3_;
                local_748._8_4_ = local_998.data._M_elems[10];
                local_748._12_4_ = local_998.data._M_elems[0xb];
                local_748._0_4_ = local_998.data._M_elems[8];
                local_748._4_4_ = local_998.data._M_elems[9];
                auStack_750[0] = local_998.data._M_elems[6];
                auStack_750[1] = local_998.data._M_elems[7];
                local_768._16_4_ = local_998.data._M_elems[4];
                local_768._20_4_ = local_998.data._M_elems[5];
                local_768._8_4_ = local_998.data._M_elems[2];
                local_768._12_4_ = local_998.data._M_elems[3];
                local_768._0_4_ = local_998.data._M_elems[0];
                local_768._4_4_ = local_998.data._M_elems[1];
                iStack_728 = local_998.exp;
                bStack_724 = local_998.neg;
                local_720._0_4_ = local_998.fpclass;
                local_720._4_4_ = local_998.prec_elem;
                pcVar21 = pcVar25;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_768,pcVar21);
              pcVar21 = &local_a10[iVar22].m_backend;
              if (local_a10[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar19 == 0) {
                  local_940[*local_938] = iVar22;
                  *local_938 = *local_938 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_768);
              if (pcVar21->fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar22 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                }
              }
              piVar24 = piVar24 + 1;
              pcVar25 = pcVar25 + 1;
            }
          }
          else {
            for (iVar17 = local_a70[lVar23 + 1]; (int)local_a78 < iVar17; iVar17 = iVar17 + -1) {
              iVar22 = *piVar24;
              local_680._0_4_ = cpp_dec_float_finite;
              local_680._4_4_ = 0x10;
              local_6c8._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff948 = (undefined1  [16])0x0;
              local_6a8 = (undefined1  [16])0x0;
              local_698[0] = 0;
              local_698[1] = 0;
              stack0xfffffffffffff970 = 0;
              uStack_68b = 0;
              iStack_688 = 0;
              bStack_684 = false;
              pcVar21 = &local_998;
              if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_6c8) {
                local_698[0] = local_998.data._M_elems[0xc];
                local_698[1] = local_998.data._M_elems[0xd];
                stack0xfffffffffffff970 = local_998.data._M_elems._56_5_;
                uStack_68b = local_998.data._M_elems[0xf]._1_3_;
                local_6a8._8_4_ = local_998.data._M_elems[10];
                local_6a8._12_4_ = local_998.data._M_elems[0xb];
                local_6a8._0_4_ = local_998.data._M_elems[8];
                local_6a8._4_4_ = local_998.data._M_elems[9];
                auStack_6b0[0] = local_998.data._M_elems[6];
                auStack_6b0[1] = local_998.data._M_elems[7];
                local_6c8._16_4_ = local_998.data._M_elems[4];
                local_6c8._20_4_ = local_998.data._M_elems[5];
                local_6c8._8_4_ = local_998.data._M_elems[2];
                local_6c8._12_4_ = local_998.data._M_elems[3];
                local_6c8._0_4_ = local_998.data._M_elems[0];
                local_6c8._4_4_ = local_998.data._M_elems[1];
                iStack_688 = local_998.exp;
                bStack_684 = local_998.neg;
                local_680._0_4_ = local_998.fpclass;
                local_680._4_4_ = local_998.prec_elem;
                pcVar21 = pcVar25;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_6c8,pcVar21);
              pcVar21 = &local_a10[iVar22].m_backend;
              if (local_a10[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar19 == 0) {
                  local_940[*local_938] = iVar22;
                  *local_938 = *local_938 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_6c8);
              if (pcVar21->fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar19 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                }
              }
              local_6d0._0_4_ = cpp_dec_float_finite;
              local_6d0._4_4_ = 0x10;
              local_718._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff8f8 = (undefined1  [16])0x0;
              local_6f8 = (undefined1  [16])0x0;
              local_6e8[0] = 0;
              local_6e8[1] = 0;
              stack0xfffffffffffff920 = 0;
              uStack_6db = 0;
              iStack_6d8 = 0;
              bStack_6d4 = false;
              pcVar21 = &local_a68;
              if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_718) {
                local_6e8[0] = local_a68.data._M_elems[0xc];
                local_6e8[1] = local_a68.data._M_elems[0xd];
                stack0xfffffffffffff920 = local_a68.data._M_elems._56_5_;
                uStack_6db = local_a68.data._M_elems[0xf]._1_3_;
                local_6f8._8_4_ = local_a68.data._M_elems[10];
                local_6f8._12_4_ = local_a68.data._M_elems[0xb];
                local_6f8._0_4_ = local_a68.data._M_elems[8];
                local_6f8._4_4_ = local_a68.data._M_elems[9];
                auStack_700[0] = local_a68.data._M_elems[6];
                auStack_700[1] = local_a68.data._M_elems[7];
                local_718._16_4_ = local_a68.data._M_elems[4];
                local_718._20_4_ = local_a68.data._M_elems[5];
                local_718._8_4_ = local_a68.data._M_elems[2];
                local_718._12_4_ = local_a68.data._M_elems[3];
                local_718._0_4_ = local_a68.data._M_elems[0];
                local_718._4_4_ = local_a68.data._M_elems[1];
                iStack_6d8 = local_a68.exp;
                bStack_6d4 = local_a68.neg;
                local_6d0._0_4_ = local_a68.fpclass;
                local_6d0._4_4_ = local_a68.prec_elem;
                pcVar21 = pcVar25;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_718,pcVar21);
              pcVar21 = &vec3[iVar22].m_backend;
              if (vec3[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar19 == 0) {
                  ridx3[*rn3] = iVar22;
                  *rn3 = *rn3 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_718);
              if (pcVar21->fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar22 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                }
              }
              piVar24 = piVar24 + 1;
              pcVar25 = pcVar25 + 1;
            }
          }
        }
        else {
          local_a98[0] = local_a68.data._M_elems[0xc];
          local_a98[1] = local_a68.data._M_elems[0xd];
          stack0xfffffffffffff570 = local_a68.data._M_elems._56_5_;
          uStack_a8b = local_a68.data._M_elems[0xf]._1_3_;
          local_aa8._8_4_ = local_a68.data._M_elems[10];
          local_aa8._12_4_ = local_a68.data._M_elems[0xb];
          local_aa8._0_4_ = local_a68.data._M_elems[8];
          local_aa8._4_4_ = local_a68.data._M_elems[9];
          local_ab8._8_4_ = local_a68.data._M_elems[6];
          local_ab8._12_4_ = local_a68.data._M_elems[7];
          local_ab8._0_4_ = local_a68.data._M_elems[4];
          local_ab8._4_4_ = local_a68.data._M_elems[5];
          local_ac8._8_4_ = local_a68.data._M_elems[2];
          local_ac8._12_4_ = local_a68.data._M_elems[3];
          local_ac8._0_4_ = local_a68.data._M_elems[0];
          local_ac8._4_4_ = local_a68.data._M_elems[1];
          auVar5 = local_ac8;
          local_d8.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
          local_d8.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
          local_d8.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
          local_d8.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
          local_d8.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
          local_d8.data._M_elems._40_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
          local_d8.data._M_elems._48_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
          local_d8.data._M_elems._56_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
          local_d8.exp = (eps3->m_backend).exp;
          local_d8.neg = (eps3->m_backend).neg;
          local_d8.fpclass = (eps3->m_backend).fpclass;
          local_d8.prec_elem = (eps3->m_backend).prec_elem;
          iStack_a88 = local_a68.exp;
          bStack_a84 = local_a68.neg;
          local_a80._0_4_ = local_a68.fpclass;
          local_a80._4_4_ = local_a68.prec_elem;
          if ((local_a68.neg == true) &&
             (local_ac8._0_4_ = local_a68.data._M_elems[0],
             local_ac8._0_4_ != 0 || local_a68.fpclass != cpp_dec_float_finite)) {
            bStack_a84 = false;
          }
          local_ac8 = auVar5;
          if ((local_d8.fpclass == cpp_dec_float_NaN || local_a68.fpclass == cpp_dec_float_NaN) ||
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_ac8,&local_d8), iVar17 < 1
             )) {
            for (iVar17 = local_a70[lVar23 + 1]; (int)local_a78 < iVar17; iVar17 = iVar17 + -1) {
              iVar22 = *piVar24;
              local_5e0._0_4_ = cpp_dec_float_finite;
              local_5e0._4_4_ = 0x10;
              local_628._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff9e8 = (undefined1  [16])0x0;
              local_608 = (undefined1  [16])0x0;
              local_5f8[0] = 0;
              local_5f8[1] = 0;
              stack0xfffffffffffffa10 = 0;
              uStack_5eb = 0;
              iStack_5e8 = 0;
              bStack_5e4 = false;
              pcVar21 = &local_998;
              if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_628) {
                local_5f8[0] = local_998.data._M_elems[0xc];
                local_5f8[1] = local_998.data._M_elems[0xd];
                stack0xfffffffffffffa10 = local_998.data._M_elems._56_5_;
                uStack_5eb = local_998.data._M_elems[0xf]._1_3_;
                local_608._8_4_ = local_998.data._M_elems[10];
                local_608._12_4_ = local_998.data._M_elems[0xb];
                local_608._0_4_ = local_998.data._M_elems[8];
                local_608._4_4_ = local_998.data._M_elems[9];
                auStack_610[0] = local_998.data._M_elems[6];
                auStack_610[1] = local_998.data._M_elems[7];
                local_628._16_4_ = local_998.data._M_elems[4];
                local_628._20_4_ = local_998.data._M_elems[5];
                local_628._8_4_ = local_998.data._M_elems[2];
                local_628._12_4_ = local_998.data._M_elems[3];
                local_628._0_4_ = local_998.data._M_elems[0];
                local_628._4_4_ = local_998.data._M_elems[1];
                iStack_5e8 = local_998.exp;
                bStack_5e4 = local_998.neg;
                local_5e0._0_4_ = local_998.fpclass;
                local_5e0._4_4_ = local_998.prec_elem;
                pcVar21 = pcVar25;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_628,pcVar21);
              pcVar21 = &local_a10[iVar22].m_backend;
              if (local_a10[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar19 == 0) {
                  local_940[*local_938] = iVar22;
                  *local_938 = *local_938 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_628);
              if (pcVar21->fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar19 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                }
              }
              local_630._0_4_ = cpp_dec_float_finite;
              local_630._4_4_ = 0x10;
              local_678._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffff998 = (undefined1  [16])0x0;
              local_658 = (undefined1  [16])0x0;
              local_648[0] = 0;
              local_648[1] = 0;
              stack0xfffffffffffff9c0 = 0;
              uStack_63b = 0;
              iStack_638 = 0;
              bStack_634 = false;
              pcVar21 = &local_9f8;
              if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_678) {
                local_648[0] = local_9f8.data._M_elems[0xc];
                local_648[1] = local_9f8.data._M_elems[0xd];
                stack0xfffffffffffff9c0 = local_9f8.data._M_elems._56_5_;
                uStack_63b = local_9f8.data._M_elems[0xf]._1_3_;
                local_658._8_4_ = local_9f8.data._M_elems[10];
                local_658._12_4_ = local_9f8.data._M_elems[0xb];
                local_658._0_4_ = local_9f8.data._M_elems[8];
                local_658._4_4_ = local_9f8.data._M_elems[9];
                auStack_660[0] = local_9f8.data._M_elems[6];
                auStack_660[1] = local_9f8.data._M_elems[7];
                local_678._16_4_ = local_9f8.data._M_elems[4];
                local_678._20_4_ = local_9f8.data._M_elems[5];
                local_678._8_4_ = local_9f8.data._M_elems[2];
                local_678._12_4_ = local_9f8.data._M_elems[3];
                local_678._0_4_ = local_9f8.data._M_elems[0];
                local_678._4_4_ = local_9f8.data._M_elems[1];
                iStack_638 = local_9f8.exp;
                bStack_634 = local_9f8.neg;
                local_630._0_4_ = local_9f8.fpclass;
                local_630._4_4_ = local_9f8.prec_elem;
                pcVar21 = pcVar25;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_678,pcVar21);
              pcVar21 = &local_a08[iVar22].m_backend;
              if (local_a08[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar19 == 0) {
                  ridx2[*rn2] = iVar22;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_678);
              if (pcVar21->fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar22 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                }
              }
              piVar24 = piVar24 + 1;
              pcVar25 = pcVar25 + 1;
            }
          }
          else {
            iVar17 = local_a70[lVar23 + 1];
            while ((int)local_a78 < iVar17) {
              iVar22 = *piVar24;
              local_450._0_4_ = cpp_dec_float_finite;
              local_450._4_4_ = 0x10;
              local_498._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffffb78 = (undefined1  [16])0x0;
              local_478 = (undefined1  [16])0x0;
              local_468[0] = 0;
              local_468[1] = 0;
              stack0xfffffffffffffba0 = 0;
              uStack_45b = 0;
              iStack_458 = 0;
              bStack_454 = false;
              pcVar21 = &local_998;
              if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_498) {
                local_468[0] = local_998.data._M_elems[0xc];
                local_468[1] = local_998.data._M_elems[0xd];
                stack0xfffffffffffffba0 = local_998.data._M_elems._56_5_;
                uStack_45b = local_998.data._M_elems[0xf]._1_3_;
                local_478._8_4_ = local_998.data._M_elems[10];
                local_478._12_4_ = local_998.data._M_elems[0xb];
                local_478._0_4_ = local_998.data._M_elems[8];
                local_478._4_4_ = local_998.data._M_elems[9];
                auStack_480[0] = local_998.data._M_elems[6];
                auStack_480[1] = local_998.data._M_elems[7];
                local_498._16_4_ = local_998.data._M_elems[4];
                local_498._20_4_ = local_998.data._M_elems[5];
                local_498._8_4_ = local_998.data._M_elems[2];
                local_498._12_4_ = local_998.data._M_elems[3];
                local_498._0_4_ = local_998.data._M_elems[0];
                local_498._4_4_ = local_998.data._M_elems[1];
                iStack_458 = local_998.exp;
                bStack_454 = local_998.neg;
                local_450._0_4_ = local_998.fpclass;
                local_450._4_4_ = local_998.prec_elem;
                pcVar21 = pcVar25;
              }
              local_9fc = iVar22;
              local_914 = iVar17;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_498,pcVar21);
              pcVar21 = &local_a10[iVar22].m_backend;
              if (local_a10[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar17 == 0) {
                  local_940[*local_938] = local_9fc;
                  *local_938 = *local_938 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_498);
              if (pcVar21->fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar17 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                }
              }
              local_4a0._0_4_ = cpp_dec_float_finite;
              local_4a0._4_4_ = 0x10;
              local_4e8._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffffb28 = (undefined1  [16])0x0;
              local_4c8 = (undefined1  [16])0x0;
              local_4b8[0] = 0;
              local_4b8[1] = 0;
              stack0xfffffffffffffb50 = 0;
              uStack_4ab = 0;
              iStack_4a8 = 0;
              bStack_4a4 = false;
              pcVar21 = &local_9f8;
              if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_4e8) {
                local_4b8[0] = local_9f8.data._M_elems[0xc];
                local_4b8[1] = local_9f8.data._M_elems[0xd];
                stack0xfffffffffffffb50 = local_9f8.data._M_elems._56_5_;
                uStack_4ab = local_9f8.data._M_elems[0xf]._1_3_;
                local_4c8._8_4_ = local_9f8.data._M_elems[10];
                local_4c8._12_4_ = local_9f8.data._M_elems[0xb];
                local_4c8._0_4_ = local_9f8.data._M_elems[8];
                local_4c8._4_4_ = local_9f8.data._M_elems[9];
                auStack_4d0[0] = local_9f8.data._M_elems[6];
                auStack_4d0[1] = local_9f8.data._M_elems[7];
                local_4e8._16_4_ = local_9f8.data._M_elems[4];
                local_4e8._20_4_ = local_9f8.data._M_elems[5];
                local_4e8._8_4_ = local_9f8.data._M_elems[2];
                local_4e8._12_4_ = local_9f8.data._M_elems[3];
                local_4e8._0_4_ = local_9f8.data._M_elems[0];
                local_4e8._4_4_ = local_9f8.data._M_elems[1];
                iStack_4a8 = local_9f8.exp;
                bStack_4a4 = local_9f8.neg;
                local_4a0._0_4_ = local_9f8.fpclass;
                local_4a0._4_4_ = local_9f8.prec_elem;
                pcVar21 = pcVar25;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_4e8,pcVar21);
              pcVar21 = &local_a08[iVar22].m_backend;
              if (local_a08[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar17 == 0) {
                  ridx2[*rn2] = local_9fc;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_4e8);
              if (pcVar21->fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar17 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                }
              }
              local_4f0._0_4_ = cpp_dec_float_finite;
              local_4f0._4_4_ = 0x10;
              local_538._0_16_ = (undefined1  [16])0x0;
              stack0xfffffffffffffad8 = (undefined1  [16])0x0;
              local_518 = (undefined1  [16])0x0;
              local_508[0] = 0;
              local_508[1] = 0;
              stack0xfffffffffffffb00 = 0;
              uStack_4fb = 0;
              iStack_4f8 = 0;
              bStack_4f4 = false;
              pcVar21 = &local_a68;
              if (pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_538) {
                local_508[0] = local_a68.data._M_elems[0xc];
                local_508[1] = local_a68.data._M_elems[0xd];
                stack0xfffffffffffffb00 = local_a68.data._M_elems._56_5_;
                uStack_4fb = local_a68.data._M_elems[0xf]._1_3_;
                local_518._8_4_ = local_a68.data._M_elems[10];
                local_518._12_4_ = local_a68.data._M_elems[0xb];
                local_518._0_4_ = local_a68.data._M_elems[8];
                local_518._4_4_ = local_a68.data._M_elems[9];
                auStack_520[0] = local_a68.data._M_elems[6];
                auStack_520[1] = local_a68.data._M_elems[7];
                local_538._16_4_ = local_a68.data._M_elems[4];
                local_538._20_4_ = local_a68.data._M_elems[5];
                local_538._8_4_ = local_a68.data._M_elems[2];
                local_538._12_4_ = local_a68.data._M_elems[3];
                local_538._0_4_ = local_a68.data._M_elems[0];
                local_538._4_4_ = local_a68.data._M_elems[1];
                iStack_4f8 = local_a68.exp;
                bStack_4f4 = local_a68.neg;
                local_4f0._0_4_ = local_a68.fpclass;
                local_4f0._4_4_ = local_a68.prec_elem;
                pcVar21 = pcVar25;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)local_538,pcVar21);
              pcVar21 = &vec3[iVar22].m_backend;
              if (vec3[iVar22].m_backend.fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar17 == 0) {
                  ridx3[*rn3] = local_9fc;
                  *rn3 = *rn3 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_538);
              if (pcVar21->fpclass != cpp_dec_float_NaN) {
                local_a80._0_4_ = cpp_dec_float_finite;
                local_a80._4_4_ = 0x10;
                local_ac8 = (undefined1  [16])0x0;
                local_ab8 = (undefined1  [16])0x0;
                local_aa8 = (undefined1  [16])0x0;
                local_a98[0] = 0;
                local_a98[1] = 0;
                stack0xfffffffffffff570 = 0;
                uStack_a8b = 0;
                iStack_a88 = 0;
                bStack_a84 = false;
                pcVar20 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
                local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
                local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
                local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
                local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
                stack0xfffffffffffff570 = (undefined5)uVar4;
                uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_a88 = pcVar20->exp;
                bStack_a84 = pcVar20->neg;
                local_a80._0_4_ = pcVar20->fpclass;
                local_a80._4_4_ = pcVar20->prec_elem;
                iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (pcVar21,(cpp_dec_float<100U,_int,_void> *)local_ac8);
                if (iVar17 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                            ((cpp_dec_float<100u,int,void> *)pcVar21,1e-100);
                }
              }
              piVar24 = piVar24 + 1;
              pcVar25 = pcVar25 + 1;
              iVar17 = local_914 + -1;
            }
          }
        }
      }
LAB_003f275c:
      lVar23 = local_9a0 + 1;
    } while (lVar23 != local_920);
    uVar16 = (uint)local_920;
    this = local_900;
  }
  if (((this->l).updateType != 0) &&
     (uVar3 = (this->l).firstUnused, local_920 = (ulong)uVar3, (int)uVar16 < (int)uVar3)) {
    local_a78 = (ulong)uVar16;
    do {
      iVar17 = local_a70[local_a78];
      local_8b0._0_4_ = cpp_dec_float_finite;
      local_8b0._4_4_ = 0x10;
      local_8f8 = (undefined1  [16])0x0;
      local_8e8 = (undefined1  [16])0x0;
      local_8d8 = (undefined1  [16])0x0;
      local_8c8[0] = 0;
      local_8c8[1] = 0;
      stack0xfffffffffffff740 = 0;
      uStack_8bb = 0;
      iStack_8b8 = 0;
      bStack_8b4 = false;
      local_540._0_4_ = cpp_dec_float_finite;
      local_540._4_4_ = 0x10;
      local_588._0_16_ = (undefined1  [16])0x0;
      stack0xfffffffffffffa88 = (undefined1  [16])0x0;
      local_568 = (undefined1  [16])0x0;
      local_558[0] = 0;
      local_558[1] = 0;
      stack0xfffffffffffffab0 = 0;
      uStack_54b = 0;
      iStack_548 = 0;
      bStack_544 = false;
      local_590._0_4_ = cpp_dec_float_finite;
      local_590._4_4_ = 0x10;
      local_5d8._0_16_ = (undefined1  [16])0x0;
      stack0xfffffffffffffa38 = (undefined1  [16])0x0;
      local_5b8 = (undefined1  [16])0x0;
      local_5a8[0] = 0;
      local_5a8[1] = 0;
      stack0xfffffffffffffa60 = 0;
      uStack_59b = 0;
      iStack_598 = 0;
      bStack_594 = false;
      iVar22 = local_a70[local_a78 + 1];
      if (iVar17 < iVar22) {
        pcVar25 = &local_928[iVar17].m_backend;
        piVar24 = local_930 + iVar17;
        do {
          pcVar20 = &local_a10[*piVar24].m_backend;
          local_a80._0_4_ = cpp_dec_float_finite;
          local_a80._4_4_ = 0x10;
          local_ac8 = (undefined1  [16])0x0;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98[0] = 0;
          local_a98[1] = 0;
          stack0xfffffffffffff570 = 0;
          uStack_a8b = 0;
          iStack_a88 = 0;
          bStack_a84 = false;
          pcVar21 = pcVar20;
          if ((pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_ac8) &&
             (pcVar21 = pcVar25, (cpp_dec_float<100U,_int,_void> *)local_ac8 != pcVar20)) {
            local_ac8 = *(undefined1 (*) [16])
                         (((cpp_dec_float<100U,_int,_void> *)&pcVar20->data)->data)._M_elems;
            local_ab8 = *(undefined1 (*) [16])
                         ((((cpp_dec_float<100U,_int,_void> *)&pcVar20->data)->data)._M_elems + 4);
            local_aa8 = *(undefined1 (*) [16])
                         ((((cpp_dec_float<100U,_int,_void> *)&pcVar20->data)->data)._M_elems + 8);
            local_a98._0_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<100U,_int,_void> *)&pcVar20->data)->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)
                     ((((cpp_dec_float<100U,_int,_void> *)&pcVar20->data)->data)._M_elems + 0xe);
            stack0xfffffffffffff570 = (undefined5)uVar4;
            uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
            iStack_a88 = pcVar20->exp;
            bStack_a84 = pcVar20->neg;
            local_a80._0_4_ = pcVar20->fpclass;
            local_a80._4_4_ = pcVar20->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_ac8,pcVar21);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)local_8f8,
                     (cpp_dec_float<100U,_int,_void> *)local_ac8);
          pcVar20 = &local_a08[*piVar24].m_backend;
          local_a80._0_4_ = cpp_dec_float_finite;
          local_a80._4_4_ = 0x10;
          local_ac8 = (undefined1  [16])0x0;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98[0] = 0;
          local_a98[1] = 0;
          stack0xfffffffffffff570 = 0;
          uStack_a8b = 0;
          iStack_a88 = 0;
          bStack_a84 = false;
          pcVar21 = pcVar20;
          if ((pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_ac8) &&
             (pcVar21 = pcVar25, (cpp_dec_float<100U,_int,_void> *)local_ac8 != pcVar20)) {
            local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
            local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
            local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
            local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
            stack0xfffffffffffff570 = (undefined5)uVar4;
            uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
            iStack_a88 = pcVar20->exp;
            bStack_a84 = pcVar20->neg;
            local_a80._0_4_ = pcVar20->fpclass;
            local_a80._4_4_ = pcVar20->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_ac8,pcVar21);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)local_588,
                     (cpp_dec_float<100U,_int,_void> *)local_ac8);
          pcVar20 = &vec3[*piVar24].m_backend;
          local_a80._0_4_ = cpp_dec_float_finite;
          local_a80._4_4_ = 0x10;
          local_ac8 = (undefined1  [16])0x0;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98[0] = 0;
          local_a98[1] = 0;
          stack0xfffffffffffff570 = 0;
          uStack_a8b = 0;
          iStack_a88 = 0;
          bStack_a84 = false;
          pcVar21 = pcVar20;
          if ((pcVar25 != (cpp_dec_float<100U,_int,_void> *)local_ac8) &&
             (pcVar21 = pcVar25, (cpp_dec_float<100U,_int,_void> *)local_ac8 != pcVar20)) {
            local_ac8 = *(undefined1 (*) [16])(pcVar20->data)._M_elems;
            local_ab8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 4);
            local_aa8 = *(undefined1 (*) [16])((pcVar20->data)._M_elems + 8);
            local_a98._0_8_ = *(undefined8 *)((pcVar20->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)((pcVar20->data)._M_elems + 0xe);
            stack0xfffffffffffff570 = (undefined5)uVar4;
            uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
            iStack_a88 = pcVar20->exp;
            bStack_a84 = pcVar20->neg;
            local_a80._0_4_ = pcVar20->fpclass;
            local_a80._4_4_ = pcVar20->prec_elem;
          }
          piVar24 = piVar24 + 1;
          pcVar25 = pcVar25 + 1;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_ac8,pcVar21);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)local_5d8,
                     (cpp_dec_float<100U,_int,_void> *)local_ac8);
          iVar22 = iVar22 + -1;
        } while (iVar17 < iVar22);
        fVar26 = (fpclass_type)local_540;
        iVar27 = SUB84(local_540,4);
        local_998.fpclass = (fpclass_type)local_8b0;
        local_998.prec_elem = local_8b0._4_4_;
      }
      else {
        local_998.prec_elem = 0x10;
        local_998.fpclass = cpp_dec_float_finite;
        fVar26 = cpp_dec_float_finite;
        iVar27 = 0x10;
      }
      auVar13 = local_568;
      auVar12 = stack0xfffffffffffffa88;
      auVar11 = local_588._0_16_;
      auVar10 = local_5b8;
      auVar9 = stack0xfffffffffffffa38;
      auVar8 = local_5d8._0_16_;
      local_aa8 = local_8d8;
      local_ab8 = local_8e8;
      local_ac8 = local_8f8;
      uVar6 = local_a78;
      local_998.data._M_elems[0xc] = local_8c8[0];
      local_998.data._M_elems[0xd] = local_8c8[1];
      local_998.data._M_elems._56_5_ = stack0xfffffffffffff740;
      local_998.data._M_elems[0xf]._1_3_ = uStack_8bb;
      local_998.data._M_elems[8] = local_8d8._0_4_;
      local_998.data._M_elems[9] = local_8d8._4_4_;
      uVar15 = local_998.data._M_elems._32_8_;
      local_998.data._M_elems[8] = local_8d8._0_4_;
      local_998.data._M_elems[9] = local_8d8._4_4_;
      local_998.data._M_elems[10] = local_8d8._8_4_;
      local_998.data._M_elems[0xb] = local_8d8._12_4_;
      local_998.data._M_elems[4] = local_8e8._0_4_;
      local_998.data._M_elems[5] = local_8e8._4_4_;
      uVar14 = local_998.data._M_elems._16_8_;
      local_998.data._M_elems[4] = local_8e8._0_4_;
      local_998.data._M_elems[5] = local_8e8._4_4_;
      local_998.data._M_elems[6] = local_8e8._8_4_;
      local_998.data._M_elems[7] = local_8e8._12_4_;
      local_998.data._M_elems[0] = local_8f8._0_4_;
      local_998.data._M_elems[1] = local_8f8._4_4_;
      uVar4 = local_998.data._M_elems._0_8_;
      local_998.data._M_elems[0] = local_8f8._0_4_;
      local_998.data._M_elems[1] = local_8f8._4_4_;
      local_998.data._M_elems[2] = local_8f8._8_4_;
      local_998.data._M_elems[3] = local_8f8._12_4_;
      local_9f8.data._M_elems[0] = local_588._0_4_;
      local_9f8.data._M_elems[1] = local_588._4_4_;
      local_9f8.data._M_elems[2] = local_588._8_4_;
      local_9f8.data._M_elems[3] = local_588._12_4_;
      local_9f8.data._M_elems[4] = local_588._16_4_;
      local_9f8.data._M_elems[5] = local_588._20_4_;
      local_9f8.data._M_elems[6] = auStack_570[0];
      local_9f8.data._M_elems[7] = auStack_570[1];
      local_9f8.data._M_elems[8] = local_568._0_4_;
      local_9f8.data._M_elems[9] = local_568._4_4_;
      local_9f8.data._M_elems[10] = local_568._8_4_;
      local_9f8.data._M_elems[0xb] = local_568._12_4_;
      local_9f8.data._M_elems[0xc] = local_558[0];
      local_9f8.data._M_elems[0xd] = local_558[1];
      local_9f8.data._M_elems._56_5_ = stack0xfffffffffffffab0;
      local_9f8.data._M_elems[0xf]._1_3_ = uStack_54b;
      local_9f8.prec_elem = iVar27;
      local_9f8.fpclass = fVar26;
      local_a68.data._M_elems[0] = local_5d8._0_4_;
      local_a68.data._M_elems[1] = local_5d8._4_4_;
      local_a68.data._M_elems[2] = local_5d8._8_4_;
      local_a68.data._M_elems[3] = local_5d8._12_4_;
      local_a68.data._M_elems[4] = local_5d8._16_4_;
      local_a68.data._M_elems[5] = local_5d8._20_4_;
      local_a68.data._M_elems[6] = auStack_5c0[0];
      local_a68.data._M_elems[7] = auStack_5c0[1];
      local_a68.data._M_elems[8] = local_5b8._0_4_;
      local_a68.data._M_elems[9] = local_5b8._4_4_;
      local_a68.data._M_elems[10] = local_5b8._8_4_;
      local_a68.data._M_elems[0xb] = local_5b8._12_4_;
      local_a68.data._M_elems[0xc] = local_5a8[0];
      local_a68.data._M_elems[0xd] = local_5a8[1];
      local_a68.data._M_elems._56_5_ = stack0xfffffffffffffa60;
      local_a68.data._M_elems[0xf]._1_3_ = uStack_59b;
      iVar17 = local_910[local_a78];
      local_a98[0] = local_8c8[0];
      local_a98[1] = local_8c8[1];
      stack0xfffffffffffff570 = stack0xfffffffffffff740;
      uStack_a8b = uStack_8bb;
      auVar5 = local_ac8;
      local_178.data._M_elems._0_8_ = *(undefined8 *)(local_908->m_backend).data._M_elems;
      local_178.data._M_elems._8_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 2);
      local_178.data._M_elems._16_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 4);
      local_178.data._M_elems._24_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 6);
      local_178.data._M_elems._32_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 8);
      local_178.data._M_elems._40_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 10);
      local_178.data._M_elems._48_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 0xc);
      local_178.data._M_elems._56_8_ = *(undefined8 *)((local_908->m_backend).data._M_elems + 0xe);
      local_178.exp = (local_908->m_backend).exp;
      local_178.neg = (local_908->m_backend).neg;
      local_178.fpclass = (local_908->m_backend).fpclass;
      local_178.prec_elem = (local_908->m_backend).prec_elem;
      local_a80._4_4_ = local_998.prec_elem;
      local_a80._0_4_ = local_998.fpclass;
      bStack_a84 = bStack_8b4;
      if (((bStack_8b4 & 1U) != 0) &&
         (local_ac8._0_4_ != 0 || local_998.fpclass != cpp_dec_float_finite)) {
        bStack_a84 = (bool)(bStack_8b4 ^ 1);
      }
      local_9a0 = (long)iVar17;
      local_a68.exp = iStack_598;
      local_a68.neg = bStack_594;
      local_a68._72_8_ = local_590;
      local_9f8.exp = iStack_548;
      local_9f8.neg = bStack_544;
      local_998.exp = iStack_8b8;
      local_998.neg = bStack_8b4;
      local_8f8 = local_ac8;
      local_8e8 = local_ab8;
      local_8d8 = local_aa8;
      local_5d8._0_16_ = auVar8;
      unique0x1000a540 = auVar9;
      local_5b8 = auVar10;
      local_588._0_16_ = auVar11;
      unique0x1000a5a0 = auVar12;
      local_568 = auVar13;
      if ((local_178.fpclass != cpp_dec_float_NaN && local_998.fpclass != cpp_dec_float_NaN) &&
         (local_ac8 = auVar5, iStack_a88 = iStack_8b8,
         iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_ac8,&local_178),
         uVar4 = local_998.data._M_elems._0_8_, uVar14 = local_998.data._M_elems._16_8_,
         uVar15 = local_998.data._M_elems._32_8_, 0 < iVar22)) {
        local_1c8.data._M_elems[0xf]._1_3_ = local_998.data._M_elems[0xf]._1_3_;
        local_1c8.data._M_elems._56_5_ = local_998.data._M_elems._56_5_;
        local_1c8.data._M_elems[0xc] = local_998.data._M_elems[0xc];
        local_1c8.data._M_elems[0xd] = local_998.data._M_elems[0xd];
        local_1c8.data._M_elems[8] = local_998.data._M_elems[8];
        local_1c8.data._M_elems[9] = local_998.data._M_elems[9];
        local_1c8.data._M_elems[10] = local_998.data._M_elems[10];
        local_1c8.data._M_elems[0xb] = local_998.data._M_elems[0xb];
        local_1c8.data._M_elems[4] = local_998.data._M_elems[4];
        local_1c8.data._M_elems[5] = local_998.data._M_elems[5];
        local_1c8.data._M_elems[6] = local_998.data._M_elems[6];
        local_1c8.data._M_elems[7] = local_998.data._M_elems[7];
        local_1c8.data._M_elems[0] = local_998.data._M_elems[0];
        local_1c8.data._M_elems[1] = local_998.data._M_elems[1];
        local_1c8.data._M_elems[2] = local_998.data._M_elems[2];
        local_1c8.data._M_elems[3] = local_998.data._M_elems[3];
        local_1c8.exp = local_998.exp;
        local_1c8.neg = local_998.neg;
        local_1c8.fpclass = local_998.fpclass;
        local_1c8.prec_elem = local_998.prec_elem;
        pcVar25 = &local_a10[local_9a0].m_backend;
        if (local_a10[local_9a0].m_backend.fpclass != cpp_dec_float_NaN) {
          local_a80._0_4_ = cpp_dec_float_finite;
          local_a80._4_4_ = 0x10;
          local_ac8 = (undefined1  [16])0x0;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98[0] = 0;
          local_a98[1] = 0;
          stack0xfffffffffffff570 = 0;
          uStack_a8b = 0;
          iStack_a88 = 0;
          bStack_a84 = false;
          pcVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ac8 = *(undefined1 (*) [16])(pcVar21->data)._M_elems;
          local_ab8 = *(undefined1 (*) [16])((pcVar21->data)._M_elems + 4);
          local_aa8 = *(undefined1 (*) [16])((pcVar21->data)._M_elems + 8);
          local_a98._0_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar21->data)._M_elems + 0xe);
          stack0xfffffffffffff570 = (undefined5)uVar4;
          uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
          iStack_a88 = pcVar21->exp;
          bStack_a84 = pcVar21->neg;
          local_a80._0_4_ = pcVar21->fpclass;
          local_a80._4_4_ = pcVar21->prec_elem;
          iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar25,(cpp_dec_float<100U,_int,_void> *)local_ac8);
          if (iVar22 == 0) {
            local_940[*local_938] = iVar17;
            *local_938 = *local_938 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (pcVar25,&local_1c8);
        uVar4 = local_998.data._M_elems._0_8_;
        uVar14 = local_998.data._M_elems._16_8_;
        uVar15 = local_998.data._M_elems._32_8_;
        if (pcVar25->fpclass != cpp_dec_float_NaN) {
          local_a80._0_4_ = cpp_dec_float_finite;
          local_a80._4_4_ = 0x10;
          local_ac8 = (undefined1  [16])0x0;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98[0] = 0;
          local_a98[1] = 0;
          stack0xfffffffffffff570 = 0;
          uStack_a8b = 0;
          iStack_a88 = 0;
          bStack_a84 = false;
          pcVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ac8 = *(undefined1 (*) [16])(pcVar21->data)._M_elems;
          local_ab8 = *(undefined1 (*) [16])((pcVar21->data)._M_elems + 4);
          local_aa8 = *(undefined1 (*) [16])((pcVar21->data)._M_elems + 8);
          local_a98._0_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar21->data)._M_elems + 0xe);
          stack0xfffffffffffff570 = (undefined5)uVar4;
          uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
          iStack_a88 = pcVar21->exp;
          bStack_a84 = pcVar21->neg;
          local_a80._0_4_ = pcVar21->fpclass;
          local_a80._4_4_ = pcVar21->prec_elem;
          iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar25,(cpp_dec_float<100U,_int,_void> *)local_ac8);
          uVar4 = local_998.data._M_elems._0_8_;
          uVar14 = local_998.data._M_elems._16_8_;
          uVar15 = local_998.data._M_elems._32_8_;
          if (iVar22 == 0) {
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)pcVar25,1e-100);
            uVar4 = local_998.data._M_elems._0_8_;
            uVar14 = local_998.data._M_elems._16_8_;
            uVar15 = local_998.data._M_elems._32_8_;
          }
        }
      }
      local_998.data._M_elems._32_8_ = uVar15;
      local_998.data._M_elems._16_8_ = uVar14;
      local_998.data._M_elems._0_8_ = uVar4;
      local_a98[0] = local_9f8.data._M_elems[0xc];
      local_a98[1] = local_9f8.data._M_elems[0xd];
      stack0xfffffffffffff570 = local_9f8.data._M_elems._56_5_;
      uStack_a8b = local_9f8.data._M_elems[0xf]._1_3_;
      local_aa8._0_4_ = local_9f8.data._M_elems[8];
      local_aa8._4_4_ = local_9f8.data._M_elems[9];
      local_aa8._8_4_ = local_9f8.data._M_elems[10];
      local_aa8._12_4_ = local_9f8.data._M_elems[0xb];
      local_ab8._0_4_ = local_9f8.data._M_elems[4];
      local_ab8._4_4_ = local_9f8.data._M_elems[5];
      local_ab8._8_4_ = local_9f8.data._M_elems[6];
      local_ab8._12_4_ = local_9f8.data._M_elems[7];
      local_ac8._0_4_ = local_9f8.data._M_elems[0];
      local_ac8._4_4_ = local_9f8.data._M_elems[1];
      uVar4 = local_ac8._0_8_;
      local_ac8._8_4_ = local_9f8.data._M_elems[2];
      local_ac8._12_4_ = local_9f8.data._M_elems[3];
      local_218.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_218.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
      local_218.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_218.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_218.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_218.data._M_elems._40_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 10);
      local_218.data._M_elems._48_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xc);
      local_218.data._M_elems._56_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 0xe);
      local_218.exp = (eps2->m_backend).exp;
      local_218.neg = (eps2->m_backend).neg;
      local_218.fpclass = (eps2->m_backend).fpclass;
      local_218.prec_elem = (eps2->m_backend).prec_elem;
      iStack_a88 = local_9f8.exp;
      bStack_a84 = local_9f8.neg;
      local_a80._0_4_ = local_9f8.fpclass;
      local_a80._4_4_ = local_9f8.prec_elem;
      if ((local_9f8.neg == true) &&
         (local_ac8._0_4_ = local_9f8.data._M_elems[0],
         local_ac8._0_4_ != 0 || local_9f8.fpclass != cpp_dec_float_finite)) {
        bStack_a84 = false;
      }
      if ((local_218.fpclass != cpp_dec_float_NaN && local_9f8.fpclass != cpp_dec_float_NaN) &&
         (local_ac8._0_8_ = uVar4,
         iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_ac8,&local_218), 0 < iVar22)) {
        local_268.data._M_elems[0xf]._1_3_ = local_9f8.data._M_elems[0xf]._1_3_;
        local_268.data._M_elems._56_5_ = local_9f8.data._M_elems._56_5_;
        local_268.data._M_elems[0xc] = local_9f8.data._M_elems[0xc];
        local_268.data._M_elems[0xd] = local_9f8.data._M_elems[0xd];
        local_268.data._M_elems[8] = local_9f8.data._M_elems[8];
        local_268.data._M_elems[9] = local_9f8.data._M_elems[9];
        local_268.data._M_elems[10] = local_9f8.data._M_elems[10];
        local_268.data._M_elems[0xb] = local_9f8.data._M_elems[0xb];
        local_268.data._M_elems[4] = local_9f8.data._M_elems[4];
        local_268.data._M_elems[5] = local_9f8.data._M_elems[5];
        local_268.data._M_elems[6] = local_9f8.data._M_elems[6];
        local_268.data._M_elems[7] = local_9f8.data._M_elems[7];
        local_268.data._M_elems[0] = local_9f8.data._M_elems[0];
        local_268.data._M_elems[1] = local_9f8.data._M_elems[1];
        local_268.data._M_elems[2] = local_9f8.data._M_elems[2];
        local_268.data._M_elems[3] = local_9f8.data._M_elems[3];
        local_268.exp = local_9f8.exp;
        local_268.neg = local_9f8.neg;
        local_268.fpclass = local_9f8.fpclass;
        local_268.prec_elem = local_9f8.prec_elem;
        pcVar25 = &local_a08[local_9a0].m_backend;
        if (local_a08[local_9a0].m_backend.fpclass != cpp_dec_float_NaN) {
          local_a80._0_4_ = cpp_dec_float_finite;
          local_a80._4_4_ = 0x10;
          local_ac8 = (undefined1  [16])0x0;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98[0] = 0;
          local_a98[1] = 0;
          stack0xfffffffffffff570 = 0;
          uStack_a8b = 0;
          iStack_a88 = 0;
          bStack_a84 = false;
          pcVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ac8._0_8_ = *(undefined8 *)(pcVar21->data)._M_elems;
          local_ac8._8_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 2);
          local_ab8._0_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 4);
          local_ab8._8_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 6);
          local_aa8._0_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 8);
          local_aa8._8_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 10);
          local_a98._0_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar21->data)._M_elems + 0xe);
          stack0xfffffffffffff570 = (undefined5)uVar4;
          uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
          iStack_a88 = pcVar21->exp;
          bStack_a84 = pcVar21->neg;
          local_a80._0_4_ = pcVar21->fpclass;
          local_a80._4_4_ = pcVar21->prec_elem;
          iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar25,(cpp_dec_float<100U,_int,_void> *)local_ac8);
          if (iVar22 == 0) {
            ridx2[*rn2] = iVar17;
            *rn2 = *rn2 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (pcVar25,&local_268);
        if (pcVar25->fpclass != cpp_dec_float_NaN) {
          local_a80._0_4_ = cpp_dec_float_finite;
          local_a80._4_4_ = 0x10;
          local_ac8 = (undefined1  [16])0x0;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98[0] = 0;
          local_a98[1] = 0;
          stack0xfffffffffffff570 = 0;
          uStack_a8b = 0;
          iStack_a88 = 0;
          bStack_a84 = false;
          pcVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ac8._0_8_ = *(undefined8 *)(pcVar21->data)._M_elems;
          local_ac8._8_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 2);
          local_ab8._0_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 4);
          local_ab8._8_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 6);
          local_aa8._0_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 8);
          local_aa8._8_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 10);
          local_a98._0_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar21->data)._M_elems + 0xe);
          stack0xfffffffffffff570 = (undefined5)uVar4;
          uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
          iStack_a88 = pcVar21->exp;
          bStack_a84 = pcVar21->neg;
          local_a80._0_4_ = pcVar21->fpclass;
          local_a80._4_4_ = pcVar21->prec_elem;
          iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar25,(cpp_dec_float<100U,_int,_void> *)local_ac8);
          if (iVar22 == 0) {
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)pcVar25,1e-100);
          }
        }
      }
      local_a98[0] = local_a68.data._M_elems[0xc];
      local_a98[1] = local_a68.data._M_elems[0xd];
      stack0xfffffffffffff570 = local_a68.data._M_elems._56_5_;
      uStack_a8b = local_a68.data._M_elems[0xf]._1_3_;
      local_aa8._8_4_ = local_a68.data._M_elems[10];
      local_aa8._12_4_ = local_a68.data._M_elems[0xb];
      local_aa8._0_4_ = local_a68.data._M_elems[8];
      local_aa8._4_4_ = local_a68.data._M_elems[9];
      local_ab8._8_4_ = local_a68.data._M_elems[6];
      local_ab8._12_4_ = local_a68.data._M_elems[7];
      local_ab8._0_4_ = local_a68.data._M_elems[4];
      local_ab8._4_4_ = local_a68.data._M_elems[5];
      local_ac8._8_4_ = local_a68.data._M_elems[2];
      local_ac8._12_4_ = local_a68.data._M_elems[3];
      local_ac8._0_4_ = local_a68.data._M_elems[0];
      local_ac8._4_4_ = local_a68.data._M_elems[1];
      auVar5 = local_ac8;
      local_2b8.data._M_elems._0_8_ = *(undefined8 *)(eps3->m_backend).data._M_elems;
      local_2b8.data._M_elems._8_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 2);
      local_2b8.data._M_elems._16_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 4);
      local_2b8.data._M_elems._24_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 6);
      local_2b8.data._M_elems._32_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 8);
      local_2b8.data._M_elems._40_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 10);
      local_2b8.data._M_elems._48_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xc);
      local_2b8.data._M_elems._56_8_ = *(undefined8 *)((eps3->m_backend).data._M_elems + 0xe);
      local_2b8.exp = (eps3->m_backend).exp;
      local_2b8.neg = (eps3->m_backend).neg;
      local_2b8.fpclass = (eps3->m_backend).fpclass;
      local_2b8.prec_elem = (eps3->m_backend).prec_elem;
      iStack_a88 = local_a68.exp;
      bStack_a84 = local_a68.neg;
      local_a80._0_4_ = local_a68.fpclass;
      local_a80._4_4_ = local_a68.prec_elem;
      if ((local_a68.neg == true) &&
         (local_ac8._0_4_ = local_a68.data._M_elems[0],
         local_ac8._0_4_ != 0 || local_a68.fpclass != cpp_dec_float_finite)) {
        bStack_a84 = false;
      }
      if ((local_2b8.fpclass != cpp_dec_float_NaN && local_a68.fpclass != cpp_dec_float_NaN) &&
         (local_ac8 = auVar5,
         iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)local_ac8,&local_2b8), 0 < iVar22)) {
        local_308.data._M_elems[0xf]._1_3_ = local_a68.data._M_elems[0xf]._1_3_;
        local_308.data._M_elems._56_5_ = local_a68.data._M_elems._56_5_;
        local_308.data._M_elems[0xc] = local_a68.data._M_elems[0xc];
        local_308.data._M_elems[0xd] = local_a68.data._M_elems[0xd];
        local_308.data._M_elems[8] = local_a68.data._M_elems[8];
        local_308.data._M_elems[9] = local_a68.data._M_elems[9];
        local_308.data._M_elems[10] = local_a68.data._M_elems[10];
        local_308.data._M_elems[0xb] = local_a68.data._M_elems[0xb];
        local_308.data._M_elems[4] = local_a68.data._M_elems[4];
        local_308.data._M_elems[5] = local_a68.data._M_elems[5];
        local_308.data._M_elems[6] = local_a68.data._M_elems[6];
        local_308.data._M_elems[7] = local_a68.data._M_elems[7];
        local_308.data._M_elems[0] = local_a68.data._M_elems[0];
        local_308.data._M_elems[1] = local_a68.data._M_elems[1];
        local_308.data._M_elems[2] = local_a68.data._M_elems[2];
        local_308.data._M_elems[3] = local_a68.data._M_elems[3];
        local_308.exp = local_a68.exp;
        local_308.neg = local_a68.neg;
        local_308.fpclass = local_a68.fpclass;
        local_308.prec_elem = local_a68.prec_elem;
        pcVar25 = &vec3[local_9a0].m_backend;
        if (vec3[local_9a0].m_backend.fpclass != cpp_dec_float_NaN) {
          local_a80._0_4_ = cpp_dec_float_finite;
          local_a80._4_4_ = 0x10;
          local_ac8 = (undefined1  [16])0x0;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98[0] = 0;
          local_a98[1] = 0;
          stack0xfffffffffffff570 = 0;
          uStack_a8b = 0;
          iStack_a88 = 0;
          bStack_a84 = false;
          pcVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ac8 = *(undefined1 (*) [16])(pcVar21->data)._M_elems;
          local_ab8 = *(undefined1 (*) [16])((pcVar21->data)._M_elems + 4);
          local_aa8 = *(undefined1 (*) [16])((pcVar21->data)._M_elems + 8);
          local_a98._0_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar21->data)._M_elems + 0xe);
          stack0xfffffffffffff570 = (undefined5)uVar4;
          uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
          iStack_a88 = pcVar21->exp;
          bStack_a84 = pcVar21->neg;
          local_a80._0_4_ = pcVar21->fpclass;
          local_a80._4_4_ = pcVar21->prec_elem;
          iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar25,(cpp_dec_float<100U,_int,_void> *)local_ac8);
          if (iVar22 == 0) {
            ridx3[*rn3] = iVar17;
            *rn3 = *rn3 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (pcVar25,&local_308);
        if (pcVar25->fpclass != cpp_dec_float_NaN) {
          local_a80._0_4_ = cpp_dec_float_finite;
          local_a80._4_4_ = 0x10;
          local_ac8 = (undefined1  [16])0x0;
          local_ab8 = (undefined1  [16])0x0;
          local_aa8 = (undefined1  [16])0x0;
          local_a98[0] = 0;
          local_a98[1] = 0;
          stack0xfffffffffffff570 = 0;
          uStack_a8b = 0;
          iStack_a88 = 0;
          bStack_a84 = false;
          pcVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::zero();
          local_ac8 = *(undefined1 (*) [16])(pcVar21->data)._M_elems;
          local_ab8 = *(undefined1 (*) [16])((pcVar21->data)._M_elems + 4);
          local_aa8 = *(undefined1 (*) [16])((pcVar21->data)._M_elems + 8);
          local_a98._0_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar21->data)._M_elems + 0xe);
          stack0xfffffffffffff570 = (undefined5)uVar4;
          uStack_a8b = (undefined3)((ulong)uVar4 >> 0x28);
          iStack_a88 = pcVar21->exp;
          bStack_a84 = pcVar21->neg;
          local_a80._0_4_ = pcVar21->fpclass;
          local_a80._4_4_ = pcVar21->prec_elem;
          iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (pcVar25,(cpp_dec_float<100U,_int,_void> *)local_ac8);
          if (iVar17 == 0) {
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)pcVar25,1e-100);
          }
        }
      }
      local_a78 = uVar6 + 1;
    } while (local_a78 != local_920);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright3(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2,
   R* vec3, int* ridx3, int& rn3, R eps3)
{
   int i, j, k, n;
   int end;
   R x, x2, x3;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x = vec[j];
      x2 = vec2[j];
      x3 = vec3[j];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         if(isNotZero(x2, eps2))
         {
            if(isNotZero(x3, eps3))
            {
               // case 1: all three vectors are nonzero at j
               for(j = lbeg[i + 1]; j > k; --j)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  n = *idx++;
                  updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
                  updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
                  updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
                  ++val;
               }
            }
            else
            {
               // case 2: 1 and 2 are nonzero at j
               for(j = lbeg[i + 1]; j > k; --j)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  n = *idx++;
                  updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
                  updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
                  ++val;
               }
            }
         }
         else if(isNotZero(x3, eps3))
         {
            // case 3: 1 and 3 are nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
               ++val;
            }
         }
         else
         {
            // case 4: only 1 is nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         if(isNotZero(x3, eps3))
         {
            // case 5: 2 and 3 are nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
               ++val;
            }
         }
         else
         {
            // case 6: only 2 is nonzero at j
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
      }
      else if(isNotZero(x3, eps3))
      {
         // case 7: only 3 is nonzero at j
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x3 * (*val), n, vec3[n], ridx3, rn3);
            ++val;
         }
      }
   }

   if(l.updateType)                      /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2, tmp3;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx] * (*val);
            tmp3 += vec3[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);
         x3 = R(tmp3);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);

         if(isNotZero(x3, eps3))
            updateSolutionVectorLright(x3, j, vec3[j], ridx3, rn3);
      }
   }
}